

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O2

ProtoStreamObjectSource * __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::NewProtoSource
          (TypeInfoTestHelper *this,CodedInputStream *coded_input,string *type_url)

{
  long *plVar1;
  Type *type;
  LogMessage *other;
  ProtoStreamObjectSource *this_00;
  LogMessage local_78;
  StringPiece local_40;
  LogFinisher local_29;
  
  plVar1 = *(long **)(this + 8);
  StringPiece::StringPiece<std::allocator<char>>(&local_40,type_url);
  type = (Type *)(**(code **)(*plVar1 + 0x18))(plVar1,local_40.ptr_,local_40.length_);
  if (*(int *)this == 0) {
    this_00 = (ProtoStreamObjectSource *)operator_new(0x40);
    ProtoStreamObjectSource::ProtoStreamObjectSource
              (this_00,coded_input,*(TypeResolver **)(this + 0x10),type);
  }
  else {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
               ,0x61);
    other = protobuf::internal::LogMessage::operator<<(&local_78,"Can not reach here.");
    protobuf::internal::LogFinisher::operator=(&local_29,other);
    protobuf::internal::LogMessage::~LogMessage(&local_78);
    this_00 = (ProtoStreamObjectSource *)0x0;
  }
  return this_00;
}

Assistant:

ProtoStreamObjectSource* TypeInfoTestHelper::NewProtoSource(
    io::CodedInputStream* coded_input, const std::string& type_url) {
  const google::protobuf::Type* type = typeinfo_->GetTypeByTypeUrl(type_url);
  switch (type_) {
    case USE_TYPE_RESOLVER: {
      return new ProtoStreamObjectSource(coded_input, type_resolver_.get(),
                                         *type);
    }
  }
  GOOGLE_LOG(FATAL) << "Can not reach here.";
  return NULL;
}